

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O1

void test_bson_append_maxkey(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  bson_t *pbVar4;
  bson_t *b;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  uint uVar8;
  code *pcVar9;
  code **ppcVar10;
  code **__haystack;
  long *plVar11;
  char *pcVar12;
  bson_t *unaff_R15;
  long lStack_d40;
  int iStack_d34;
  undefined1 auStack_d30 [8];
  char *pcStack_d28;
  undefined4 uStack_d20;
  undefined4 uStack_d1c;
  undefined2 uStack_d18;
  undefined2 uStack_d16;
  undefined4 uStack_d14;
  undefined2 uStack_d10;
  undefined8 uStack_d0e;
  undefined1 auStack_d00 [128];
  undefined1 auStack_c80 [368];
  undefined1 *puStack_b10;
  code *pcStack_b08;
  long lStack_a98;
  undefined7 uStack_a90;
  char cStack_a89;
  undefined1 uStack_a88;
  undefined1 auStack_a80 [128];
  undefined1 auStack_a00 [376];
  code *apcStack_888 [16];
  undefined1 auStack_808 [8];
  undefined1 auStack_800 [128];
  undefined1 auStack_780 [128];
  undefined1 auStack_700 [272];
  undefined8 uStack_5f0;
  char *pcStack_5e8;
  char *pcStack_5e0;
  bson_t *pbStack_5d8;
  undefined8 uStack_5d0;
  char *pcStack_5c8;
  char *pcStack_5c0;
  bson_t *pbStack_5b8;
  long *plStack_5b0;
  bson_t *pbStack_5a8;
  bson_t *pbStack_5a0;
  char *pcStack_598;
  code *apcStack_590 [2];
  long lStack_580;
  int iStack_578;
  int iStack_574;
  undefined1 auStack_570 [504];
  char acStack_378 [72];
  bson_t *pbStack_330;
  int iStack_28c;
  undefined1 auStack_288 [8];
  undefined1 auStack_280 [248];
  bson_t *pbStack_188;
  code *apcStack_180 [2];
  bson_t *pbStack_170;
  bson_t *pbStack_168;
  bson_t *pbStack_160;
  undefined8 uStack_150;
  undefined4 uStack_148;
  bson_t *pbStack_140;
  undefined1 *puStack_138;
  undefined1 auStack_110 [32];
  bson_t *apbStack_f0 [2];
  bson_t *pbStack_e0;
  bson_t *apbStack_d8 [2];
  bson_t *pbStack_c8;
  bson_t *apbStack_c0 [2];
  bson_t *pbStack_b0;
  bson_t *apbStack_a8 [2];
  bson_t *pbStack_98;
  code *pcStack_90;
  bson_t *pbStack_80;
  code *pcStack_78;
  undefined1 auStack_64 [12];
  bson_t *pbStack_58;
  
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_maxkey(pbVar3,"maxkey",0xffffffff);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test37.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_maxkey_cold_1();
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_minkey(pbVar3,"minkey",0xffffffff);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test36.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_minkey_cold_1();
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_null(pbVar3,"hello",0xffffffff);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test18.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_null_cold_1();
  pcStack_78 = (code *)0x1220be;
  pbStack_58 = pbVar3;
  bson_oid_init_from_string(auStack_64,"1234567890abcdef1234abcd");
  pcStack_78 = (code *)0x1220c3;
  pbVar3 = (bson_t *)bson_new();
  pcStack_78 = (code *)0x1220dd;
  cVar1 = bson_append_oid(pbVar3,"oid",0xffffffff,auStack_64);
  if (cVar1 != '\0') {
    pcStack_78 = (code *)0x1220ed;
    pbVar4 = get_bson("test22.bson");
    pcStack_78 = (code *)0x1220fb;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    pcStack_78 = (code *)0x122103;
    bson_destroy(pbVar3);
    pcStack_78 = (code *)0x12210b;
    bson_destroy(pbVar4);
    return;
  }
  pcStack_78 = test_bson_append_regex;
  test_bson_append_oid_cold_1();
  pcStack_90 = (code *)0x122121;
  pbStack_80 = pbVar3;
  pcStack_78 = (code *)auStack_64;
  pbVar3 = (bson_t *)bson_new();
  pcStack_90 = (code *)0x122146;
  cVar1 = bson_append_regex(pbVar3,"regex",0xffffffff,"^abcd","ilx");
  if (cVar1 != '\0') {
    pcStack_90 = (code *)0x122156;
    pbVar4 = get_bson("test27.bson");
    pcStack_90 = (code *)0x122164;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    pcStack_90 = (code *)0x12216c;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  pcStack_90 = test_bson_append_utf8;
  test_bson_append_regex_cold_1();
  apbStack_a8[0] = (bson_t *)0x122189;
  pbStack_98 = pbVar3;
  pcStack_90 = (code *)auStack_64;
  pbVar3 = (bson_t *)bson_new();
  apbStack_a8[0] = (bson_t *)0x122198;
  pbVar4 = get_bson("test11.bson");
  apbStack_a8[0] = (bson_t *)0x1221bc;
  cVar1 = bson_append_utf8(pbVar3,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_a8[0] = (bson_t *)0x1221cb;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    apbStack_a8[0] = (bson_t *)0x1221d3;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  apbStack_a8[0] = (bson_t *)test_bson_append_symbol;
  test_bson_append_utf8_cold_1();
  apbStack_c0[0] = (bson_t *)0x1221f0;
  pbStack_b0 = pbVar3;
  apbStack_a8[0] = pbVar4;
  pbVar3 = (bson_t *)bson_new();
  apbStack_c0[0] = (bson_t *)0x1221ff;
  pbVar4 = get_bson("test32.bson");
  apbStack_c0[0] = (bson_t *)0x122223;
  cVar1 = bson_append_symbol(pbVar3,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_c0[0] = (bson_t *)0x122232;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    apbStack_c0[0] = (bson_t *)0x12223a;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  apbStack_c0[0] = (bson_t *)test_bson_append_time_t;
  test_bson_append_symbol_cold_1();
  apbStack_d8[0] = (bson_t *)0x122257;
  pbStack_c8 = pbVar3;
  apbStack_c0[0] = pbVar4;
  pbVar3 = (bson_t *)bson_new();
  apbStack_d8[0] = (bson_t *)0x122273;
  cVar1 = bson_append_time_t(pbVar3,"time_t",0xffffffff,0x499602d2);
  if (cVar1 != '\0') {
    apbStack_d8[0] = (bson_t *)0x122283;
    pbVar4 = get_bson("test26.bson");
    apbStack_d8[0] = (bson_t *)0x122291;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    apbStack_d8[0] = (bson_t *)0x122299;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  apbStack_d8[0] = (bson_t *)test_bson_append_timestamp;
  test_bson_append_time_t_cold_1();
  apbStack_f0[0] = (bson_t *)0x1222b6;
  pbStack_e0 = pbVar3;
  apbStack_d8[0] = pbVar4;
  pbVar3 = (bson_t *)bson_new();
  apbStack_f0[0] = (bson_t *)0x1222d8;
  cVar1 = bson_append_timestamp(pbVar3,"timestamp",0xffffffff,0x4d2,0x2694);
  if (cVar1 != '\0') {
    apbStack_f0[0] = (bson_t *)0x1222e8;
    pbVar4 = get_bson("test35.bson");
    apbStack_f0[0] = (bson_t *)0x1222f6;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    apbStack_f0[0] = (bson_t *)0x1222fe;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  apbStack_f0[0] = (bson_t *)test_bson_append_timeval;
  test_bson_append_timestamp_cold_1();
  b = (bson_t *)auStack_110;
  auStack_110._0_4_ = 0x499602d2;
  auStack_110._4_4_ = 0;
  auStack_110[8] = '\0';
  auStack_110[9] = '\0';
  auStack_110[10] = '\0';
  auStack_110[0xb] = '\0';
  auStack_110[0xc] = '\0';
  auStack_110[0xd] = '\0';
  auStack_110[0xe] = '\0';
  auStack_110[0xf] = '\0';
  auStack_110._24_8_ = pbVar3;
  apbStack_f0[0] = pbVar4;
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_timeval(pbVar3,"time_t",0xffffffff,auStack_110);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test26.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_timeval_cold_1();
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_undefined(pbVar3,"undefined",0xffffffff);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test25.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_undefined_cold_1();
  pbStack_140 = pbVar3;
  puStack_138 = auStack_110;
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_int32(pbVar3,"int",0xffffffff,1);
  if (cVar1 == '\0') {
    test_bson_append_general_cold_1();
LAB_00122c2c:
    test_bson_append_general_cold_2();
LAB_00122c31:
    test_bson_append_general_cold_3();
LAB_00122c36:
    test_bson_append_general_cold_4();
LAB_00122c3b:
    test_bson_append_general_cold_5();
LAB_00122c40:
    test_bson_append_general_cold_6();
LAB_00122c45:
    test_bson_append_general_cold_7();
LAB_00122c4a:
    test_bson_append_general_cold_8();
LAB_00122c4f:
    test_bson_append_general_cold_9();
LAB_00122c54:
    test_bson_append_general_cold_10();
LAB_00122c59:
    test_bson_append_general_cold_11();
LAB_00122c5e:
    test_bson_append_general_cold_12();
LAB_00122c63:
    test_bson_append_general_cold_13();
LAB_00122c68:
    test_bson_append_general_cold_14();
LAB_00122c6d:
    test_bson_append_general_cold_15();
LAB_00122c72:
    test_bson_append_general_cold_16();
LAB_00122c77:
    test_bson_append_general_cold_17();
LAB_00122c7c:
    test_bson_append_general_cold_18();
LAB_00122c81:
    test_bson_append_general_cold_19();
LAB_00122c86:
    test_bson_append_general_cold_20();
LAB_00122c8b:
    test_bson_append_general_cold_21();
LAB_00122c90:
    test_bson_append_general_cold_22();
LAB_00122c95:
    test_bson_append_general_cold_23();
LAB_00122c9a:
    test_bson_append_general_cold_24();
LAB_00122c9f:
    test_bson_append_general_cold_25();
LAB_00122ca4:
    test_bson_append_general_cold_26();
LAB_00122ca9:
    test_bson_append_general_cold_27();
LAB_00122cae:
    test_bson_append_general_cold_28();
LAB_00122cb3:
    test_bson_append_general_cold_29();
LAB_00122cb8:
    test_bson_append_general_cold_30();
LAB_00122cbd:
    test_bson_append_general_cold_31();
LAB_00122cc2:
    test_bson_append_general_cold_32();
LAB_00122cc7:
    test_bson_append_general_cold_33();
LAB_00122ccc:
    test_bson_append_general_cold_34();
LAB_00122cd1:
    test_bson_append_general_cold_35();
LAB_00122cd6:
    test_bson_append_general_cold_36();
LAB_00122cdb:
    test_bson_append_general_cold_37();
  }
  else {
    b = get_bson("test1.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_int64(pbVar3,"int64",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122c2c;
    b = get_bson("test2.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_double(0xd916872b,pbVar3,"double",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c31;
    b = get_bson("test3.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(pbVar3,"string",0xffffffff,"some string",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c36;
    pbVar4 = get_bson("test5.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    b = (bson_t *)bson_new();
    cVar1 = bson_append_int32(b,"0",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122c3b;
    cVar1 = bson_append_int32(b,"1",0xffffffff,2);
    if (cVar1 == '\0') goto LAB_00122c40;
    cVar1 = bson_append_int32(b,"2",0xffffffff,3);
    if (cVar1 == '\0') goto LAB_00122c45;
    cVar1 = bson_append_int32(b,"3",0xffffffff,4);
    if (cVar1 == '\0') goto LAB_00122c4a;
    cVar1 = bson_append_int32(b,"4",0xffffffff,5);
    if (cVar1 == '\0') goto LAB_00122c4f;
    cVar1 = bson_append_int32(b,"5",0xffffffff,6);
    if (cVar1 == '\0') goto LAB_00122c54;
    cVar1 = bson_append_array(pbVar3,"array[int]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c59;
    unaff_R15 = get_bson("test6.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,unaff_R15);
    bson_destroy(unaff_R15);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    b = (bson_t *)bson_new();
    cVar1 = bson_append_double(0xd916872b,b,"0",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c5e;
    cVar1 = bson_append_double(0x6c8b4396,b,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c63;
    cVar1 = bson_append_array(pbVar3,"array[double]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c68;
    unaff_R15 = get_bson("test7.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,unaff_R15);
    bson_destroy(unaff_R15);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    b = (bson_t *)bson_new();
    cVar1 = bson_append_int32(b,"int",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122c6d;
    cVar1 = bson_append_document(pbVar3,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c72;
    unaff_R15 = get_bson("test8.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,unaff_R15);
    bson_destroy(unaff_R15);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_null(pbVar3,"null",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c77;
    b = get_bson("test9.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_regex(pbVar3,"regex",0xffffffff,"1234","i");
    if (cVar1 == '\0') goto LAB_00122c7c;
    b = get_bson("test10.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,b);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(pbVar3,"hello",0xffffffff,"world",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c81;
    pbVar4 = get_bson("test11.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    b = (bson_t *)bson_new();
    pbVar3 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(pbVar3,"0",0xffffffff,"awesome",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c86;
    cVar1 = bson_append_double(0x33333333,pbVar3,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c8b;
    cVar1 = bson_append_int32(pbVar3,"2",0xffffffff,0x7c2);
    if (cVar1 == '\0') goto LAB_00122c90;
    cVar1 = bson_append_array(b,"BSON",0xffffffff,pbVar3);
    if (cVar1 == '\0') goto LAB_00122c95;
    unaff_R15 = get_bson("test12.bson");
    BSON_ASSERT_BSON_EQUAL(b,unaff_R15);
    bson_destroy(unaff_R15);
    bson_destroy(b);
    bson_destroy(pbVar3);
    pbVar3 = (bson_t *)bson_new();
    uStack_150 = 0;
    uStack_148 = 0x45230100;
    cVar1 = bson_append_oid(pbVar3,"_id",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c9a;
    b = (bson_t *)bson_new();
    cVar1 = bson_append_oid(b,"_id",0xffffffff,&uStack_150);
    if (cVar1 == '\0') goto LAB_00122c9f;
    unaff_R15 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(unaff_R15,"0",0xffffffff,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122ca4;
    cVar1 = bson_append_utf8(unaff_R15,"1",0xffffffff,"2",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122ca9;
    cVar1 = bson_append_utf8(unaff_R15,"2",0xffffffff,"3",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cae;
    cVar1 = bson_append_utf8(unaff_R15,"3",0xffffffff,"4",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cb3;
    cVar1 = bson_append_array(b,"tags",0xffffffff,unaff_R15);
    if (cVar1 == '\0') goto LAB_00122cb8;
    bson_destroy(unaff_R15);
    cVar1 = bson_append_utf8(b,"text",0xffffffff,"asdfanother",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cbd;
    unaff_R15 = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(unaff_R15,"name",0xffffffff,"blah",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cc2;
    cVar1 = bson_append_document(b,"source",0xffffffff,unaff_R15);
    if (cVar1 == '\0') goto LAB_00122cc7;
    bson_destroy(unaff_R15);
    cVar1 = bson_append_document(pbVar3,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122ccc;
    bson_destroy(b);
    b = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"source",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cd1;
    cVar1 = bson_append_array(pbVar3,"type",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122cd6;
    bson_destroy(b);
    b = (bson_t *)bson_new();
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"server_created_at",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cdb;
    cVar1 = bson_append_array(pbVar3,"missing",0xffffffff,b);
    if (cVar1 != '\0') {
      bson_destroy(b);
      pbVar4 = get_bson("test17.bson");
      BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
      bson_destroy(pbVar4);
      bson_destroy(pbVar3);
      return;
    }
  }
  test_bson_append_general_cold_38();
  pcVar9 = (code *)0x64;
  apcStack_180[0] = (code *)0x122cf6;
  pbStack_170 = pbVar3;
  pbStack_168 = b;
  pbStack_160 = unaff_R15;
  pbVar3 = (bson_t *)bson_new();
  while( true ) {
    apcStack_180[0] = (code *)0x122d05;
    pbVar4 = (bson_t *)bson_new();
    apcStack_180[0] = (code *)0x122d1b;
    cVar1 = bson_append_document(pbVar4,"a",0xffffffff,pbVar3);
    if (cVar1 == '\0') break;
    apcStack_180[0] = (code *)0x122d27;
    bson_destroy(pbVar3);
    uVar8 = (int)pcVar9 - 1;
    pcVar9 = (code *)(ulong)uVar8;
    pbVar3 = pbVar4;
    if (uVar8 == 0) {
      apcStack_180[0] = (code *)0x122d3a;
      pbVar3 = get_bson("test38.bson");
      apcStack_180[0] = (code *)0x122d48;
      BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
      apcStack_180[0] = (code *)0x122d50;
      bson_destroy(pbVar3);
      bson_destroy(pbVar4);
      return;
    }
  }
  apcStack_180[0] = test_bson_utf8_key;
  test_bson_append_deep_cold_1();
  __haystack = apcStack_180;
  pbStack_188 = pbVar4;
  apcStack_180[0] = pcVar9;
  pbVar3 = get_bson("eurokey.bson");
  cVar1 = bson_validate(pbVar3,0,auStack_288);
  if (cVar1 == '\0') {
    test_bson_utf8_key_cold_1();
LAB_00122e27:
    test_bson_utf8_key_cold_2();
LAB_00122e2c:
    test_bson_utf8_key_cold_3();
LAB_00122e31:
    test_bson_utf8_key_cold_4();
LAB_00122e36:
    test_bson_utf8_key_cold_7();
LAB_00122e3b:
    test_bson_utf8_key_cold_5();
  }
  else {
    cVar1 = bson_iter_init(auStack_280,pbVar3);
    if (cVar1 == '\0') goto LAB_00122e27;
    cVar1 = bson_iter_next(auStack_280);
    if (cVar1 == '\0') goto LAB_00122e2c;
    pcVar5 = (char *)bson_iter_key(auStack_280);
    iVar2 = strcmp(pcVar5,anon_var_dwarf_49b7);
    if (iVar2 != 0) goto LAB_00122e31;
    pcVar5 = (char *)bson_iter_utf8(auStack_280,&iStack_28c);
    if (pcVar5 == (char *)0x0) goto LAB_00122e36;
    if (iStack_28c != 0xf) goto LAB_00122e3b;
    iVar2 = strcmp(pcVar5,anon_var_dwarf_49b7);
    if (iVar2 == 0) {
      bson_destroy(pbVar3);
      return;
    }
  }
  test_bson_utf8_key_cold_6();
  pbVar4 = (bson_t *)0x1;
  pcVar12 = "test%u.bson";
  pcVar5 = acStack_378;
  plVar11 = &lStack_580;
  pbStack_330 = pbVar3;
  do {
    apcStack_590[0] = (code *)0x122e83;
    bson_snprintf(pcVar5,0x40,"test%u.bson",pbVar4);
    apcStack_590[0] = (code *)0x122e8b;
    pbVar3 = get_bson(pcVar5);
    apcStack_590[0] = (code *)0x122e9b;
    cVar1 = bson_validate(pbVar3,0,plVar11);
    if (cVar1 == '\0') {
      apcStack_590[0] = (code *)0x123ddb;
      test_bson_validate_cold_1();
      goto LAB_00123ddb;
    }
    apcStack_590[0] = (code *)0x122eab;
    bson_destroy(pbVar3);
    uVar8 = (int)pbVar4 + 1;
    pbVar4 = (bson_t *)(ulong)uVar8;
  } while (uVar8 != 0x27);
  apcStack_590[0] = (code *)0x122ebe;
  pbVar4 = get_bson("codewscope.bson");
  apcStack_590[0] = (code *)0x122ed0;
  cVar1 = bson_validate(pbVar4,0,&lStack_580);
  if (cVar1 == '\0') {
LAB_00123ddb:
    apcStack_590[0] = (code *)0x123de0;
    test_bson_validate_cold_2();
LAB_00123de0:
    apcStack_590[0] = (code *)0x123de5;
    test_bson_validate_cold_3();
LAB_00123de5:
    apcStack_590[0] = (code *)0x123dea;
    test_bson_validate_cold_158();
LAB_00123dea:
    apcStack_590[0] = (code *)0x123def;
    test_bson_validate_cold_157();
LAB_00123def:
    apcStack_590[0] = (code *)0x123df4;
    test_bson_validate_cold_155();
LAB_00123df4:
    apcStack_590[0] = (code *)0x123df9;
    test_bson_validate_cold_154();
LAB_00123df9:
    apcStack_590[0] = (code *)0x123dfe;
    test_bson_validate_cold_152();
LAB_00123dfe:
    apcStack_590[0] = (code *)0x123e03;
    test_bson_validate_cold_151();
LAB_00123e03:
    apcStack_590[0] = (code *)0x123e08;
    test_bson_validate_cold_149();
LAB_00123e08:
    apcStack_590[0] = (code *)0x123e0d;
    test_bson_validate_cold_148();
LAB_00123e0d:
    apcStack_590[0] = (code *)0x123e12;
    test_bson_validate_cold_146();
LAB_00123e12:
    apcStack_590[0] = (code *)0x123e17;
    test_bson_validate_cold_145();
LAB_00123e17:
    apcStack_590[0] = (code *)0x123e1c;
    test_bson_validate_cold_143();
LAB_00123e1c:
    apcStack_590[0] = (code *)0x123e21;
    test_bson_validate_cold_142();
LAB_00123e21:
    apcStack_590[0] = (code *)0x123e26;
    test_bson_validate_cold_140();
LAB_00123e26:
    apcStack_590[0] = (code *)0x123e2b;
    test_bson_validate_cold_139();
LAB_00123e2b:
    apcStack_590[0] = (code *)0x123e30;
    test_bson_validate_cold_137();
LAB_00123e30:
    apcStack_590[0] = (code *)0x123e35;
    test_bson_validate_cold_136();
LAB_00123e35:
    apcStack_590[0] = (code *)0x123e3a;
    test_bson_validate_cold_134();
LAB_00123e3a:
    apcStack_590[0] = (code *)0x123e3f;
    test_bson_validate_cold_133();
LAB_00123e3f:
    apcStack_590[0] = (code *)0x123e44;
    test_bson_validate_cold_131();
LAB_00123e44:
    apcStack_590[0] = (code *)0x123e49;
    test_bson_validate_cold_130();
LAB_00123e49:
    apcStack_590[0] = (code *)0x123e4e;
    test_bson_validate_cold_128();
LAB_00123e4e:
    apcStack_590[0] = (code *)0x123e53;
    test_bson_validate_cold_127();
LAB_00123e53:
    apcStack_590[0] = (code *)0x123e58;
    test_bson_validate_cold_125();
LAB_00123e58:
    apcStack_590[0] = (code *)0x123e5d;
    test_bson_validate_cold_124();
LAB_00123e5d:
    apcStack_590[0] = (code *)0x123e62;
    test_bson_validate_cold_122();
LAB_00123e62:
    apcStack_590[0] = (code *)0x123e67;
    test_bson_validate_cold_121();
LAB_00123e67:
    apcStack_590[0] = (code *)0x123e6c;
    test_bson_validate_cold_119();
LAB_00123e6c:
    apcStack_590[0] = (code *)0x123e71;
    test_bson_validate_cold_118();
LAB_00123e71:
    apcStack_590[0] = (code *)0x123e76;
    test_bson_validate_cold_116();
LAB_00123e76:
    apcStack_590[0] = (code *)0x123e7b;
    test_bson_validate_cold_115();
LAB_00123e7b:
    apcStack_590[0] = (code *)0x123e80;
    test_bson_validate_cold_113();
LAB_00123e80:
    apcStack_590[0] = (code *)0x123e85;
    test_bson_validate_cold_112();
LAB_00123e85:
    apcStack_590[0] = (code *)0x123e8a;
    test_bson_validate_cold_110();
LAB_00123e8a:
    apcStack_590[0] = (code *)0x123e8f;
    test_bson_validate_cold_109();
LAB_00123e8f:
    apcStack_590[0] = (code *)0x123e94;
    test_bson_validate_cold_107();
LAB_00123e94:
    apcStack_590[0] = (code *)0x123e99;
    test_bson_validate_cold_106();
LAB_00123e99:
    apcStack_590[0] = (code *)0x123e9e;
    test_bson_validate_cold_104();
LAB_00123e9e:
    apcStack_590[0] = (code *)0x123ea3;
    test_bson_validate_cold_103();
LAB_00123ea3:
    apcStack_590[0] = (code *)0x123ea8;
    test_bson_validate_cold_101();
LAB_00123ea8:
    apcStack_590[0] = (code *)0x123ead;
    test_bson_validate_cold_100();
LAB_00123ead:
    apcStack_590[0] = (code *)0x123eb2;
    test_bson_validate_cold_98();
LAB_00123eb2:
    apcStack_590[0] = (code *)0x123eb7;
    test_bson_validate_cold_97();
LAB_00123eb7:
    apcStack_590[0] = (code *)0x123ebc;
    test_bson_validate_cold_95();
LAB_00123ebc:
    apcStack_590[0] = (code *)0x123ec1;
    test_bson_validate_cold_94();
LAB_00123ec1:
    apcStack_590[0] = (code *)0x123ec6;
    test_bson_validate_cold_92();
LAB_00123ec6:
    apcStack_590[0] = (code *)0x123ecb;
    test_bson_validate_cold_91();
LAB_00123ecb:
    apcStack_590[0] = (code *)0x123ed0;
    test_bson_validate_cold_73();
LAB_00123ed0:
    apcStack_590[0] = (code *)0x123ed5;
    test_bson_validate_cold_74();
LAB_00123ed5:
    apcStack_590[0] = (code *)0x123eda;
    test_bson_validate_cold_75();
LAB_00123eda:
    apcStack_590[0] = (code *)0x123edf;
    test_bson_validate_cold_89();
LAB_00123edf:
    apcStack_590[0] = (code *)0x123ee4;
    test_bson_validate_cold_78();
LAB_00123ee4:
    apcStack_590[0] = (code *)0x123ee9;
    test_bson_validate_cold_87();
LAB_00123ee9:
    apcStack_590[0] = (code *)0x123eee;
    test_bson_validate_cold_81();
LAB_00123eee:
    apcStack_590[0] = (code *)0x123ef3;
    test_bson_validate_cold_85();
    ppcVar10 = __haystack;
LAB_00123ef3:
    apcStack_590[0] = (code *)0x123ef8;
    test_bson_validate_cold_4();
LAB_00123ef8:
    apcStack_590[0] = (code *)0x123efd;
    test_bson_validate_cold_5();
    __haystack = ppcVar10;
LAB_00123efd:
    apcStack_590[0] = (code *)0x123f02;
    test_bson_validate_cold_6();
LAB_00123f02:
    apcStack_590[0] = (code *)0x123f0a;
    test_bson_validate_cold_156();
LAB_00123f0a:
    apcStack_590[0] = (code *)0x123f0f;
    test_bson_validate_cold_7();
LAB_00123f0f:
    apcStack_590[0] = (code *)0x123f14;
    test_bson_validate_cold_8();
LAB_00123f14:
    apcStack_590[0] = (code *)0x123f19;
    test_bson_validate_cold_9();
LAB_00123f19:
    apcStack_590[0] = (code *)0x123f21;
    test_bson_validate_cold_153();
LAB_00123f21:
    apcStack_590[0] = (code *)0x123f26;
    test_bson_validate_cold_10();
LAB_00123f26:
    apcStack_590[0] = (code *)0x123f2b;
    test_bson_validate_cold_11();
LAB_00123f2b:
    apcStack_590[0] = (code *)0x123f30;
    test_bson_validate_cold_12();
LAB_00123f30:
    apcStack_590[0] = (code *)0x123f38;
    test_bson_validate_cold_150();
LAB_00123f38:
    apcStack_590[0] = (code *)0x123f3d;
    test_bson_validate_cold_13();
LAB_00123f3d:
    apcStack_590[0] = (code *)0x123f42;
    test_bson_validate_cold_14();
LAB_00123f42:
    apcStack_590[0] = (code *)0x123f47;
    test_bson_validate_cold_15();
LAB_00123f47:
    apcStack_590[0] = (code *)0x123f4f;
    test_bson_validate_cold_147();
LAB_00123f4f:
    apcStack_590[0] = (code *)0x123f54;
    test_bson_validate_cold_16();
LAB_00123f54:
    apcStack_590[0] = (code *)0x123f59;
    test_bson_validate_cold_17();
LAB_00123f59:
    apcStack_590[0] = (code *)0x123f5e;
    test_bson_validate_cold_18();
LAB_00123f5e:
    apcStack_590[0] = (code *)0x123f66;
    test_bson_validate_cold_144();
LAB_00123f66:
    apcStack_590[0] = (code *)0x123f6b;
    test_bson_validate_cold_19();
LAB_00123f6b:
    apcStack_590[0] = (code *)0x123f70;
    test_bson_validate_cold_20();
LAB_00123f70:
    apcStack_590[0] = (code *)0x123f75;
    test_bson_validate_cold_21();
LAB_00123f75:
    apcStack_590[0] = (code *)0x123f7d;
    test_bson_validate_cold_141();
LAB_00123f7d:
    apcStack_590[0] = (code *)0x123f82;
    test_bson_validate_cold_22();
LAB_00123f82:
    apcStack_590[0] = (code *)0x123f87;
    test_bson_validate_cold_23();
LAB_00123f87:
    apcStack_590[0] = (code *)0x123f8c;
    test_bson_validate_cold_24();
LAB_00123f8c:
    apcStack_590[0] = (code *)0x123f94;
    test_bson_validate_cold_138();
LAB_00123f94:
    apcStack_590[0] = (code *)0x123f99;
    test_bson_validate_cold_25();
LAB_00123f99:
    apcStack_590[0] = (code *)0x123f9e;
    test_bson_validate_cold_26();
LAB_00123f9e:
    apcStack_590[0] = (code *)0x123fa3;
    test_bson_validate_cold_27();
LAB_00123fa3:
    apcStack_590[0] = (code *)0x123fab;
    test_bson_validate_cold_135();
LAB_00123fab:
    apcStack_590[0] = (code *)0x123fb0;
    test_bson_validate_cold_28();
LAB_00123fb0:
    apcStack_590[0] = (code *)0x123fb5;
    test_bson_validate_cold_29();
LAB_00123fb5:
    apcStack_590[0] = (code *)0x123fba;
    test_bson_validate_cold_30();
LAB_00123fba:
    apcStack_590[0] = (code *)0x123fc2;
    test_bson_validate_cold_132();
LAB_00123fc2:
    apcStack_590[0] = (code *)0x123fc7;
    test_bson_validate_cold_31();
LAB_00123fc7:
    apcStack_590[0] = (code *)0x123fcc;
    test_bson_validate_cold_32();
LAB_00123fcc:
    apcStack_590[0] = (code *)0x123fd1;
    test_bson_validate_cold_33();
LAB_00123fd1:
    apcStack_590[0] = (code *)0x123fd9;
    test_bson_validate_cold_129();
LAB_00123fd9:
    apcStack_590[0] = (code *)0x123fde;
    test_bson_validate_cold_34();
LAB_00123fde:
    apcStack_590[0] = (code *)0x123fe3;
    test_bson_validate_cold_35();
LAB_00123fe3:
    apcStack_590[0] = (code *)0x123fe8;
    test_bson_validate_cold_36();
LAB_00123fe8:
    apcStack_590[0] = (code *)0x123ff0;
    test_bson_validate_cold_126();
LAB_00123ff0:
    apcStack_590[0] = (code *)0x123ff5;
    test_bson_validate_cold_37();
LAB_00123ff5:
    apcStack_590[0] = (code *)0x123ffa;
    test_bson_validate_cold_38();
LAB_00123ffa:
    apcStack_590[0] = (code *)0x123fff;
    test_bson_validate_cold_39();
LAB_00123fff:
    apcStack_590[0] = (code *)0x124007;
    test_bson_validate_cold_123();
LAB_00124007:
    apcStack_590[0] = (code *)0x12400c;
    test_bson_validate_cold_40();
LAB_0012400c:
    apcStack_590[0] = (code *)0x124011;
    test_bson_validate_cold_41();
LAB_00124011:
    apcStack_590[0] = (code *)0x124016;
    test_bson_validate_cold_42();
LAB_00124016:
    apcStack_590[0] = (code *)0x12401e;
    test_bson_validate_cold_120();
LAB_0012401e:
    apcStack_590[0] = (code *)0x124023;
    test_bson_validate_cold_43();
LAB_00124023:
    apcStack_590[0] = (code *)0x124028;
    test_bson_validate_cold_44();
LAB_00124028:
    apcStack_590[0] = (code *)0x12402d;
    test_bson_validate_cold_45();
LAB_0012402d:
    apcStack_590[0] = (code *)0x124035;
    test_bson_validate_cold_117();
LAB_00124035:
    apcStack_590[0] = (code *)0x12403a;
    test_bson_validate_cold_46();
LAB_0012403a:
    apcStack_590[0] = (code *)0x12403f;
    test_bson_validate_cold_47();
LAB_0012403f:
    apcStack_590[0] = (code *)0x124044;
    test_bson_validate_cold_48();
LAB_00124044:
    apcStack_590[0] = (code *)0x12404c;
    test_bson_validate_cold_114();
LAB_0012404c:
    apcStack_590[0] = (code *)0x124051;
    test_bson_validate_cold_49();
LAB_00124051:
    apcStack_590[0] = (code *)0x124056;
    test_bson_validate_cold_50();
LAB_00124056:
    apcStack_590[0] = (code *)0x12405b;
    test_bson_validate_cold_51();
LAB_0012405b:
    apcStack_590[0] = (code *)0x124063;
    test_bson_validate_cold_111();
LAB_00124063:
    apcStack_590[0] = (code *)0x124068;
    test_bson_validate_cold_52();
LAB_00124068:
    apcStack_590[0] = (code *)0x12406d;
    test_bson_validate_cold_53();
LAB_0012406d:
    apcStack_590[0] = (code *)0x124072;
    test_bson_validate_cold_54();
LAB_00124072:
    apcStack_590[0] = (code *)0x12407a;
    test_bson_validate_cold_108();
LAB_0012407a:
    apcStack_590[0] = (code *)0x12407f;
    test_bson_validate_cold_55();
LAB_0012407f:
    apcStack_590[0] = (code *)0x124084;
    test_bson_validate_cold_56();
LAB_00124084:
    apcStack_590[0] = (code *)0x124089;
    test_bson_validate_cold_57();
LAB_00124089:
    apcStack_590[0] = (code *)0x124091;
    test_bson_validate_cold_105();
LAB_00124091:
    apcStack_590[0] = (code *)0x124096;
    test_bson_validate_cold_58();
LAB_00124096:
    apcStack_590[0] = (code *)0x12409b;
    test_bson_validate_cold_59();
LAB_0012409b:
    apcStack_590[0] = (code *)0x1240a0;
    test_bson_validate_cold_60();
LAB_001240a0:
    apcStack_590[0] = (code *)0x1240a8;
    test_bson_validate_cold_102();
LAB_001240a8:
    apcStack_590[0] = (code *)0x1240ad;
    test_bson_validate_cold_61();
LAB_001240ad:
    apcStack_590[0] = (code *)0x1240b2;
    test_bson_validate_cold_62();
LAB_001240b2:
    apcStack_590[0] = (code *)0x1240b7;
    test_bson_validate_cold_63();
LAB_001240b7:
    apcStack_590[0] = (code *)0x1240bf;
    test_bson_validate_cold_99();
LAB_001240bf:
    apcStack_590[0] = (code *)0x1240c4;
    test_bson_validate_cold_64();
LAB_001240c4:
    apcStack_590[0] = (code *)0x1240c9;
    test_bson_validate_cold_65();
LAB_001240c9:
    apcStack_590[0] = (code *)0x1240ce;
    test_bson_validate_cold_66();
LAB_001240ce:
    apcStack_590[0] = (code *)0x1240d6;
    test_bson_validate_cold_96();
LAB_001240d6:
    apcStack_590[0] = (code *)0x1240db;
    test_bson_validate_cold_67();
LAB_001240db:
    apcStack_590[0] = (code *)0x1240e0;
    test_bson_validate_cold_68();
LAB_001240e0:
    apcStack_590[0] = (code *)0x1240e5;
    test_bson_validate_cold_69();
LAB_001240e5:
    apcStack_590[0] = (code *)0x1240ed;
    test_bson_validate_cold_93();
LAB_001240ed:
    apcStack_590[0] = (code *)0x1240f2;
    test_bson_validate_cold_70();
LAB_001240f2:
    apcStack_590[0] = (code *)0x1240f7;
    test_bson_validate_cold_71();
LAB_001240f7:
    apcStack_590[0] = (code *)0x1240fc;
    test_bson_validate_cold_72();
LAB_001240fc:
    apcStack_590[0] = (code *)0x124104;
    test_bson_validate_cold_90();
LAB_00124104:
    apcStack_590[0] = (code *)0x124109;
    test_bson_validate_cold_76();
LAB_00124109:
    apcStack_590[0] = (code *)0x12410e;
    test_bson_validate_cold_77();
LAB_0012410e:
    apcStack_590[0] = (code *)0x124116;
    test_bson_validate_cold_88();
LAB_00124116:
    apcStack_590[0] = (code *)0x12411b;
    test_bson_validate_cold_79();
LAB_0012411b:
    apcStack_590[0] = (code *)0x124120;
    test_bson_validate_cold_80();
LAB_00124120:
    apcStack_590[0] = (code *)0x124128;
    test_bson_validate_cold_86();
LAB_00124128:
    apcStack_590[0] = (code *)0x12412d;
    test_bson_validate_cold_82();
LAB_0012412d:
    apcStack_590[0] = (code *)0x124132;
    test_bson_validate_cold_83();
  }
  else {
    apcStack_590[0] = (code *)0x122ee0;
    bson_destroy(pbVar4);
    apcStack_590[0] = (code *)0x122eec;
    pbVar4 = get_bson("empty_key.bson");
    apcStack_590[0] = (code *)0x122f01;
    cVar1 = bson_validate(pbVar4,7,&lStack_580);
    if (cVar1 == '\0') goto LAB_00123de0;
    apcStack_590[0] = (code *)0x122f11;
    bson_destroy(pbVar4);
    apcStack_590[0] = (code *)0x122f1d;
    pcVar12 = (char *)get_bson("overflow2.bson");
    apcStack_590[0] = (code *)0x122f2f;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123de5;
    ppcVar10 = apcStack_180;
    if (lStack_580 != 9) goto LAB_00123ef3;
    apcStack_590[0] = (code *)0x122f55;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123dea;
    ppcVar10 = apcStack_180;
    if (iStack_578 != 3) goto LAB_00123ef8;
    __haystack = apcStack_180;
    if (iStack_574 != 0) goto LAB_00123efd;
    __haystack = (code **)auStack_570;
    apcStack_590[0] = (code *)0x122f8a;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f02;
    apcStack_590[0] = (code *)0x122f9b;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x122fa7;
    pcVar12 = (char *)get_bson("trailingnull.bson");
    apcStack_590[0] = (code *)0x122fb9;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123def;
    if (lStack_580 != 0xe) goto LAB_00123f0a;
    apcStack_590[0] = (code *)0x122fdf;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123df4;
    if (iStack_578 != 3) goto LAB_00123f0f;
    if (iStack_574 != 0) goto LAB_00123f14;
    apcStack_590[0] = (code *)0x12300f;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f19;
    apcStack_590[0] = (code *)0x123020;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x12302c;
    pcVar12 = (char *)get_bson("dollarquery.bson");
    apcStack_590[0] = (code *)0x123041;
    cVar1 = bson_validate(pcVar12,6,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123df9;
    if (lStack_580 != 4) goto LAB_00123f21;
    apcStack_590[0] = (code *)0x12306a;
    cVar1 = bson_validate_with_error(pcVar12,6,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123dfe;
    if (iStack_578 != 3) goto LAB_00123f26;
    if (iStack_574 != 2) goto LAB_00123f2b;
    apcStack_590[0] = (code *)0x12309b;
    pcVar6 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$query\"");
    if (pcVar6 == (char *)0x0) goto LAB_00123f30;
    apcStack_590[0] = (code *)0x1230ac;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x1230b8;
    pcVar12 = (char *)get_bson("dotquery.bson");
    apcStack_590[0] = (code *)0x1230cd;
    cVar1 = bson_validate(pcVar12,6,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e03;
    if (lStack_580 != 4) goto LAB_00123f38;
    apcStack_590[0] = (code *)0x1230f6;
    cVar1 = bson_validate_with_error(pcVar12,6,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e08;
    if (iStack_578 != 3) goto LAB_00123f3d;
    if (iStack_574 != 4) goto LAB_00123f42;
    apcStack_590[0] = (code *)0x123127;
    pcVar6 = strstr((char *)__haystack,"keys cannot contain \".\": \"abc.def\"");
    if (pcVar6 == (char *)0x0) goto LAB_00123f47;
    apcStack_590[0] = (code *)0x123138;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123144;
    pcVar12 = (char *)get_bson("overflow3.bson");
    apcStack_590[0] = (code *)0x123156;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e0d;
    if (lStack_580 != 9) goto LAB_00123f4f;
    apcStack_590[0] = (code *)0x12317c;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e12;
    if (iStack_578 != 3) goto LAB_00123f54;
    if (iStack_574 != 0) goto LAB_00123f59;
    apcStack_590[0] = (code *)0x1231ac;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f5e;
    apcStack_590[0] = (code *)0x1231bd;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x1231c9;
    pcVar12 = (char *)get_bson("overflow3.bson");
    apcStack_590[0] = (code *)0x1231de;
    cVar1 = bson_validate(pcVar12,1,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e17;
    if (lStack_580 != 9) goto LAB_00123f66;
    apcStack_590[0] = (code *)0x123207;
    cVar1 = bson_validate_with_error(pcVar12,1,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e1c;
    if (iStack_578 != 3) goto LAB_00123f6b;
    if (iStack_574 != 0) goto LAB_00123f70;
    apcStack_590[0] = (code *)0x123237;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f75;
    apcStack_590[0] = (code *)0x123248;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123254;
    pcVar12 = (char *)get_bson("overflow4.bson");
    apcStack_590[0] = (code *)0x123266;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e21;
    if (lStack_580 != 9) goto LAB_00123f7d;
    apcStack_590[0] = (code *)0x12328c;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e26;
    if (iStack_578 != 3) goto LAB_00123f82;
    if (iStack_574 != 0) goto LAB_00123f87;
    apcStack_590[0] = (code *)0x1232bc;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123f8c;
    apcStack_590[0] = (code *)0x1232cd;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x1232d9;
    pcVar12 = (char *)get_bson("empty_key.bson");
    apcStack_590[0] = (code *)0x1232ee;
    cVar1 = bson_validate(pcVar12,0x10,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e2b;
    if (lStack_580 != 4) goto LAB_00123f94;
    apcStack_590[0] = (code *)0x123317;
    cVar1 = bson_validate_with_error(pcVar12,0x10,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e30;
    if (iStack_578 != 3) goto LAB_00123f99;
    if (iStack_574 != 0x10) goto LAB_00123f9e;
    apcStack_590[0] = (code *)0x123348;
    pcVar6 = strstr((char *)__haystack,"empty key");
    if (pcVar6 == (char *)0x0) goto LAB_00123fa3;
    apcStack_590[0] = (code *)0x123359;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123365;
    pcVar12 = (char *)get_bson("test40.bson");
    apcStack_590[0] = (code *)0x123377;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e35;
    if (lStack_580 != 6) goto LAB_00123fab;
    apcStack_590[0] = (code *)0x12339d;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e3a;
    if (iStack_578 != 3) goto LAB_00123fb0;
    if (iStack_574 != 0) goto LAB_00123fb5;
    apcStack_590[0] = (code *)0x1233cd;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123fba;
    apcStack_590[0] = (code *)0x1233de;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x1233ea;
    pcVar12 = (char *)get_bson("test41.bson");
    apcStack_590[0] = (code *)0x1233fc;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e3f;
    if (lStack_580 != 6) goto LAB_00123fc2;
    apcStack_590[0] = (code *)0x123422;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e44;
    if (iStack_578 != 3) goto LAB_00123fc7;
    if (iStack_574 != 0) goto LAB_00123fcc;
    apcStack_590[0] = (code *)0x123452;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123fd1;
    apcStack_590[0] = (code *)0x123463;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x12346f;
    pcVar12 = (char *)get_bson("test42.bson");
    apcStack_590[0] = (code *)0x123481;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e49;
    if (lStack_580 != 6) goto LAB_00123fd9;
    apcStack_590[0] = (code *)0x1234a7;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e4e;
    if (iStack_578 != 3) goto LAB_00123fde;
    if (iStack_574 != 0) goto LAB_00123fe3;
    apcStack_590[0] = (code *)0x1234d7;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123fe8;
    apcStack_590[0] = (code *)0x1234e8;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x1234f4;
    pcVar12 = (char *)get_bson("test43.bson");
    apcStack_590[0] = (code *)0x123506;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e53;
    if (lStack_580 != 6) goto LAB_00123ff0;
    apcStack_590[0] = (code *)0x12352c;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e58;
    if (iStack_578 != 3) goto LAB_00123ff5;
    if (iStack_574 != 0) goto LAB_00123ffa;
    apcStack_590[0] = (code *)0x12355c;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00123fff;
    apcStack_590[0] = (code *)0x12356d;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123579;
    pcVar12 = (char *)get_bson("test44.bson");
    apcStack_590[0] = (code *)0x12358b;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e5d;
    if (lStack_580 != 6) goto LAB_00124007;
    apcStack_590[0] = (code *)0x1235b1;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e62;
    if (iStack_578 != 3) goto LAB_0012400c;
    if (iStack_574 != 0) goto LAB_00124011;
    apcStack_590[0] = (code *)0x1235e1;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00124016;
    apcStack_590[0] = (code *)0x1235f2;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x1235fe;
    pcVar12 = (char *)get_bson("test45.bson");
    apcStack_590[0] = (code *)0x123610;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e67;
    if (lStack_580 != 6) goto LAB_0012401e;
    apcStack_590[0] = (code *)0x123636;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e6c;
    if (iStack_578 != 3) goto LAB_00124023;
    if (iStack_574 != 0) goto LAB_00124028;
    apcStack_590[0] = (code *)0x123666;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_0012402d;
    apcStack_590[0] = (code *)0x123677;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123683;
    pcVar12 = (char *)get_bson("test46.bson");
    apcStack_590[0] = (code *)0x123695;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e71;
    if (lStack_580 != 6) goto LAB_00124035;
    apcStack_590[0] = (code *)0x1236bb;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e76;
    if (iStack_578 != 3) goto LAB_0012403a;
    if (iStack_574 != 0) goto LAB_0012403f;
    apcStack_590[0] = (code *)0x1236eb;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00124044;
    apcStack_590[0] = (code *)0x1236fc;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123708;
    pcVar12 = (char *)get_bson("test47.bson");
    apcStack_590[0] = (code *)0x12371a;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e7b;
    if (lStack_580 != 6) goto LAB_0012404c;
    apcStack_590[0] = (code *)0x123740;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e80;
    if (iStack_578 != 3) goto LAB_00124051;
    if (iStack_574 != 0) goto LAB_00124056;
    apcStack_590[0] = (code *)0x123770;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_0012405b;
    apcStack_590[0] = (code *)0x123781;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x12378d;
    pcVar12 = (char *)get_bson("test48.bson");
    apcStack_590[0] = (code *)0x12379f;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e85;
    if (lStack_580 != 6) goto LAB_00124063;
    apcStack_590[0] = (code *)0x1237c5;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e8a;
    if (iStack_578 != 3) goto LAB_00124068;
    if (iStack_574 != 0) goto LAB_0012406d;
    apcStack_590[0] = (code *)0x1237f5;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00124072;
    apcStack_590[0] = (code *)0x123806;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123812;
    pcVar12 = (char *)get_bson("test49.bson");
    apcStack_590[0] = (code *)0x123824;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e8f;
    if (lStack_580 != 6) goto LAB_0012407a;
    apcStack_590[0] = (code *)0x12384a;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e94;
    if (iStack_578 != 3) goto LAB_0012407f;
    if (iStack_574 != 0) goto LAB_00124084;
    apcStack_590[0] = (code *)0x12387a;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_00124089;
    apcStack_590[0] = (code *)0x12388b;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123897;
    pcVar12 = (char *)get_bson("test50.bson");
    apcStack_590[0] = (code *)0x1238a9;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123e99;
    if (lStack_580 != 10) goto LAB_00124091;
    apcStack_590[0] = (code *)0x1238cf;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123e9e;
    if (iStack_578 != 3) goto LAB_00124096;
    if (iStack_574 != 0) goto LAB_0012409b;
    apcStack_590[0] = (code *)0x1238ff;
    pcVar6 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar6 == (char *)0x0) goto LAB_001240a0;
    apcStack_590[0] = (code *)0x123910;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x12391c;
    pcVar12 = (char *)get_bson("test51.bson");
    apcStack_590[0] = (code *)0x12392e;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123ea3;
    if (lStack_580 != 10) goto LAB_001240a8;
    apcStack_590[0] = (code *)0x123954;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123ea8;
    if (iStack_578 != 3) goto LAB_001240ad;
    if (iStack_574 != 0) goto LAB_001240b2;
    apcStack_590[0] = (code *)0x123984;
    pcVar6 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar6 == (char *)0x0) goto LAB_001240b7;
    apcStack_590[0] = (code *)0x123995;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x1239a1;
    pcVar12 = (char *)get_bson("test52.bson");
    apcStack_590[0] = (code *)0x1239b3;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123ead;
    if (lStack_580 != 9) goto LAB_001240bf;
    apcStack_590[0] = (code *)0x1239d9;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123eb2;
    if (iStack_578 != 3) goto LAB_001240c4;
    if (iStack_574 != 0) goto LAB_001240c9;
    apcStack_590[0] = (code *)0x123a09;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_001240ce;
    apcStack_590[0] = (code *)0x123a1a;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123a26;
    pcVar12 = (char *)get_bson("test53.bson");
    apcStack_590[0] = (code *)0x123a38;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123eb7;
    if (lStack_580 != 6) goto LAB_001240d6;
    apcStack_590[0] = (code *)0x123a5e;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123ebc;
    if (iStack_578 != 3) goto LAB_001240db;
    if (iStack_574 != 0) goto LAB_001240e0;
    apcStack_590[0] = (code *)0x123a8e;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_001240e5;
    apcStack_590[0] = (code *)0x123a9f;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123aab;
    pcVar12 = (char *)get_bson("test54.bson");
    apcStack_590[0] = (code *)0x123abd;
    cVar1 = bson_validate(pcVar12,0,&lStack_580);
    if (cVar1 != '\0') goto LAB_00123ec1;
    if (lStack_580 != 0xc) goto LAB_001240ed;
    apcStack_590[0] = (code *)0x123ae3;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123ec6;
    if (iStack_578 != 3) goto LAB_001240f2;
    if (iStack_574 != 0) goto LAB_001240f7;
    apcStack_590[0] = (code *)0x123b13;
    pcVar6 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar6 == (char *)0x0) goto LAB_001240fc;
    apcStack_590[0] = (code *)0x123b24;
    bson_destroy(pcVar12);
    apcStack_590[0] = (code *)0x123b29;
    pcVar12 = (char *)bson_bcon_magic();
    pbVar4 = (bson_t *)0x148ce7;
    plVar11 = (long *)0x148f98;
    pcStack_598 = (char *)0x0;
    pbStack_5a0 = (bson_t *)0x148ce7;
    pbStack_5a8 = (bson_t *)0x1;
    plStack_5b0 = (long *)0xf;
    pcStack_5c0 = "$id";
    pcStack_5c8 = "collection";
    uStack_5d0 = 0x123b79;
    pbStack_5b8 = (bson_t *)pcVar12;
    pcVar5 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar12,0);
    apcStack_590[0] = (code *)0x123b8f;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_578);
    if (cVar1 == '\0') goto LAB_00123ecb;
    apcStack_590[0] = (code *)0x123ba9;
    cVar1 = bson_validate_with_error(pcVar5,2,&iStack_578);
    if (cVar1 == '\0') goto LAB_00123ed0;
    apcStack_590[0] = (code *)0x123bb9;
    bson_destroy(pcVar5);
    pcVar5 = "$id";
    pcStack_598 = (char *)0x0;
    pbStack_5a0 = (bson_t *)0x148ce7;
    pbStack_5a8 = (bson_t *)0x1;
    plStack_5b0 = (long *)0x123bec;
    pbVar3 = (bson_t *)bcon_new(0,"my_dbref","{","$id",pcVar12,0xf);
    apcStack_590[0] = (code *)0x123c02;
    cVar1 = bson_validate_with_error(pbVar3,0,&iStack_578);
    if (cVar1 == '\0') goto LAB_00123ed5;
    apcStack_590[0] = (code *)0x123c1c;
    cVar1 = bson_validate_with_error(pbVar3,2,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123eda;
    if (iStack_578 != 3) goto LAB_00124104;
    if (iStack_574 != 2) goto LAB_00124109;
    apcStack_590[0] = (code *)0x123c4d;
    pcVar6 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$id\"");
    if (pcVar6 == (char *)0x0) goto LAB_0012410e;
    apcStack_590[0] = (code *)0x123c5e;
    bson_destroy(pbVar3);
    pcStack_598 = (char *)0x0;
    pbStack_5a0 = (bson_t *)0x148ce7;
    pbVar3 = (bson_t *)0x145c6e;
    pbStack_5a8 = (bson_t *)0x145c6e;
    plStack_5b0 = (long *)0x0;
    pcStack_5c0 = "$ref";
    pcStack_5c8 = "collection";
    uStack_5d0 = 0x123c96;
    pbStack_5b8 = (bson_t *)pcVar12;
    plVar11 = (long *)bcon_new(0,"my_dbref","{","$ref",pcVar12,0);
    apcStack_590[0] = (code *)0x123cac;
    cVar1 = bson_validate_with_error(plVar11,0,&iStack_578);
    if (cVar1 == '\0') goto LAB_00123edf;
    apcStack_590[0] = (code *)0x123cc6;
    cVar1 = bson_validate_with_error(plVar11,2,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123ee4;
    if (iStack_578 != 3) goto LAB_00124116;
    if (iStack_574 != 2) goto LAB_0012411b;
    apcStack_590[0] = (code *)0x123cf7;
    pcVar6 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$ref\"");
    if (pcVar6 == (char *)0x0) goto LAB_00124120;
    apcStack_590[0] = (code *)0x123d08;
    bson_destroy(plVar11);
    pcStack_598 = (char *)0x0;
    pbStack_5a0 = (bson_t *)0x148ce7;
    pbStack_5a8 = (bson_t *)0x1;
    plStack_5b0 = (long *)0xf;
    pcStack_5c0 = "$id";
    pcStack_5c8 = (char *)0x2;
    uStack_5d0 = 0xf;
    pcStack_5e0 = "extra";
    pcStack_5e8 = "collection";
    uStack_5f0 = 0x123d52;
    pbStack_5d8 = (bson_t *)pcVar12;
    pbStack_5b8 = (bson_t *)pcVar12;
    pcVar12 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar12,0);
    apcStack_590[0] = (code *)0x123d68;
    cVar1 = bson_validate_with_error(pcVar12,0,&iStack_578);
    if (cVar1 == '\0') goto LAB_00123ee9;
    apcStack_590[0] = (code *)0x123d82;
    cVar1 = bson_validate_with_error(pcVar12,2,&iStack_578);
    if (cVar1 != '\0') goto LAB_00123eee;
    if (iStack_578 != 3) goto LAB_00124128;
    if (iStack_574 != 2) goto LAB_0012412d;
    apcStack_590[0] = (code *)0x123db3;
    pcVar6 = strstr((char *)__haystack,"invalid key within DBRef subdocument: \"extra\"");
    if (pcVar6 != (char *)0x0) {
      apcStack_590[0] = (code *)0x123dc4;
      bson_destroy(pcVar12);
      return;
    }
  }
  apcStack_590[0] = test_bson_validate_dbref;
  test_bson_validate_cold_84();
  apcStack_888[0] = (code *)0x124162;
  pbStack_5b8 = pbVar4;
  plStack_5b0 = plVar11;
  pbStack_5a8 = pbVar3;
  pbStack_5a0 = (bson_t *)pcVar12;
  pcStack_598 = pcVar5;
  apcStack_590[0] = (code *)__haystack;
  bson_init(auStack_800);
  apcStack_888[0] = (code *)0x124181;
  bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
  apcStack_888[0] = (code *)0x1241a2;
  bson_append_utf8(auStack_780,"$ref",4,"foo",3);
  apcStack_888[0] = (code *)0x1241ad;
  bson_append_document_end(auStack_800,auStack_780);
  apcStack_888[0] = (code *)0x1241bf;
  cVar1 = bson_validate(auStack_800,2,auStack_808);
  if (cVar1 == '\0') {
    apcStack_888[0] = (code *)0x1241d7;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x1241df;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x1241fe;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x12421f;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x124240;
    bson_append_utf8(auStack_780,"extra",5,"field",5);
    apcStack_888[0] = (code *)0x12424b;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x12425d;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') goto LAB_00124b32;
    apcStack_888[0] = (code *)0x124275;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x12427d;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x12429e;
    bson_append_utf8(auStack_800,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x1242bf;
    bson_append_utf8(auStack_800,"$id",3,"bar",3);
    apcStack_888[0] = (code *)0x1242d1;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') goto LAB_00124b37;
    apcStack_888[0] = (code *)0x1242e9;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x1242f1;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x124310;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x124331;
    bson_append_utf8(auStack_780,"extra",5,"field",5);
    apcStack_888[0] = (code *)0x124352;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x124373;
    bson_append_utf8(auStack_780,"$id",3,"bar",3);
    apcStack_888[0] = (code *)0x12437e;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x124390;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') goto LAB_00124b3c;
    apcStack_888[0] = (code *)0x1243a8;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x1243b0;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x1243cf;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x1243f0;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x124411;
    bson_append_utf8(auStack_780,"$db",3,"bar",3);
    apcStack_888[0] = (code *)0x12441c;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x12442e;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') goto LAB_00124b41;
    apcStack_888[0] = (code *)0x124446;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x12444e;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x12446d;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x124486;
    bson_append_int32(auStack_780,"$ref",4,1);
    apcStack_888[0] = (code *)0x1244a7;
    bson_append_utf8(auStack_780,"$id",3,"bar",3);
    apcStack_888[0] = (code *)0x1244b2;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x1244c4;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') goto LAB_00124b46;
    apcStack_888[0] = (code *)0x1244dc;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x1244e4;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x124503;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x12451c;
    bson_append_int32(auStack_780,"$ref",4,1);
    apcStack_888[0] = (code *)0x124527;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x124539;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') goto LAB_00124b4b;
    apcStack_888[0] = (code *)0x124551;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x124559;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x124578;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x124599;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x1245ba;
    bson_append_utf8(auStack_780,"$id",3,"bar",3);
    apcStack_888[0] = (code *)0x1245d3;
    bson_append_int32(auStack_780,"$db",3,1);
    apcStack_888[0] = (code *)0x1245de;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x1245f0;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') goto LAB_00124b50;
    apcStack_888[0] = (code *)0x124608;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x124610;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x12462f;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x124650;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x124671;
    bson_append_utf8(auStack_780,"$id",3,"bar",3);
    apcStack_888[0] = (code *)0x12468a;
    bson_append_int32(auStack_780,"$db",3,1);
    apcStack_888[0] = (code *)0x1246ab;
    bson_append_utf8(auStack_780,"extra",5,"field",5);
    apcStack_888[0] = (code *)0x1246b6;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x1246c8;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') goto LAB_00124b55;
    apcStack_888[0] = (code *)0x1246e0;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x1246e8;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x124707;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x124728;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x124749;
    bson_append_utf8(auStack_780,"$id",3,"bar",3);
    apcStack_888[0] = (code *)0x12476a;
    bson_append_utf8(auStack_780,"extra",5,"field",5);
    apcStack_888[0] = (code *)0x12478b;
    bson_append_utf8(auStack_780,"$db",3,"baz",3);
    apcStack_888[0] = (code *)0x124796;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x1247a8;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') goto LAB_00124b5a;
    apcStack_888[0] = (code *)0x1247c0;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x1247c8;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x1247e7;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x124808;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x124829;
    bson_append_utf8(auStack_780,"$id",3,"bar",3);
    apcStack_888[0] = (code *)0x124834;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x124846;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 == '\0') goto LAB_00124b5f;
    apcStack_888[0] = (code *)0x12485e;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x124866;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x124885;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x1248a9;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x1248cb;
    bson_append_document_begin(auStack_780,"$id",3,auStack_700);
    apcStack_888[0] = (code *)0x1248e8;
    bson_append_utf8(auStack_700,"$ref",4,"foo2",4);
    apcStack_888[0] = (code *)0x124905;
    bson_append_utf8(auStack_700,"$id",3,"bar2",4);
    apcStack_888[0] = (code *)0x124929;
    bson_append_utf8(auStack_700,"$db",3,"baz2",4);
    apcStack_888[0] = (code *)0x124934;
    bson_append_document_end(auStack_780,auStack_700);
    apcStack_888[0] = (code *)0x124951;
    bson_append_utf8(auStack_780,"$db",3,"baz",3);
    apcStack_888[0] = (code *)0x12495c;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x12496e;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 == '\0') goto LAB_00124b64;
    apcStack_888[0] = (code *)0x124986;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x12498e;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x1249ad;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x1249ce;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x1249ef;
    bson_append_utf8(auStack_780,"$id",3,"bar",3);
    apcStack_888[0] = (code *)0x124a10;
    bson_append_utf8(auStack_780,"$db",3,"baz",3);
    apcStack_888[0] = (code *)0x124a1b;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x124a2d;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 == '\0') goto LAB_00124b69;
    apcStack_888[0] = (code *)0x124a45;
    bson_destroy(auStack_800);
    apcStack_888[0] = (code *)0x124a4d;
    bson_init(auStack_800);
    apcStack_888[0] = (code *)0x124a6c;
    bson_append_document_begin(auStack_800,"dbref",5,auStack_780);
    apcStack_888[0] = (code *)0x124a8d;
    bson_append_utf8(auStack_780,"$ref",4,"foo",3);
    apcStack_888[0] = (code *)0x124aae;
    bson_append_utf8(auStack_780,"$id",3,"bar",3);
    apcStack_888[0] = (code *)0x124acf;
    bson_append_utf8(auStack_780,"$db",3,"baz",3);
    apcStack_888[0] = (code *)0x124af0;
    bson_append_utf8(auStack_780,"extra",5,"field",5);
    apcStack_888[0] = (code *)0x124afb;
    bson_append_document_end(auStack_800,auStack_780);
    apcStack_888[0] = (code *)0x124b0d;
    cVar1 = bson_validate(auStack_800,2,auStack_808);
    if (cVar1 != '\0') {
      apcStack_888[0] = (code *)0x124b1e;
      bson_destroy(auStack_800);
      return;
    }
  }
  else {
    apcStack_888[0] = (code *)0x124b32;
    test_bson_validate_dbref_cold_14();
LAB_00124b32:
    apcStack_888[0] = (code *)0x124b37;
    test_bson_validate_dbref_cold_13();
LAB_00124b37:
    apcStack_888[0] = (code *)0x124b3c;
    test_bson_validate_dbref_cold_12();
LAB_00124b3c:
    apcStack_888[0] = (code *)0x124b41;
    test_bson_validate_dbref_cold_11();
LAB_00124b41:
    apcStack_888[0] = (code *)0x124b46;
    test_bson_validate_dbref_cold_10();
LAB_00124b46:
    apcStack_888[0] = (code *)0x124b4b;
    test_bson_validate_dbref_cold_9();
LAB_00124b4b:
    apcStack_888[0] = (code *)0x124b50;
    test_bson_validate_dbref_cold_8();
LAB_00124b50:
    apcStack_888[0] = (code *)0x124b55;
    test_bson_validate_dbref_cold_7();
LAB_00124b55:
    apcStack_888[0] = (code *)0x124b5a;
    test_bson_validate_dbref_cold_6();
LAB_00124b5a:
    apcStack_888[0] = (code *)0x124b5f;
    test_bson_validate_dbref_cold_5();
LAB_00124b5f:
    apcStack_888[0] = (code *)0x124b64;
    test_bson_validate_dbref_cold_1();
LAB_00124b64:
    apcStack_888[0] = (code *)0x124b69;
    test_bson_validate_dbref_cold_2();
LAB_00124b69:
    apcStack_888[0] = (code *)0x124b6e;
    test_bson_validate_dbref_cold_3();
  }
  apcStack_888[0] = test_bson_validate_bool;
  test_bson_validate_dbref_cold_4();
  _uStack_a90 = 0x100620800000009;
  uStack_a88 = 0;
  lStack_a98 = 0;
  pcStack_b08 = (code *)0x124bb3;
  apcStack_888[0] = (code *)apcStack_590;
  cVar1 = bson_init_static(auStack_a00,&stack0xfffffffffffff570,9);
  if (cVar1 == '\0') {
    pcStack_b08 = (code *)0x124cb2;
    test_bson_validate_bool_cold_1();
LAB_00124cb2:
    pcStack_b08 = (code *)0x124cb7;
    test_bson_validate_bool_cold_2();
LAB_00124cb7:
    pcStack_b08 = (code *)0x124cbc;
    test_bson_validate_bool_cold_3();
LAB_00124cbc:
    pcStack_b08 = (code *)0x124cc1;
    test_bson_validate_bool_cold_4();
LAB_00124cc1:
    pcStack_b08 = (code *)0x124cc6;
    test_bson_validate_bool_cold_5();
LAB_00124cc6:
    pcStack_b08 = (code *)0x124ccb;
    test_bson_validate_bool_cold_6();
LAB_00124ccb:
    pcStack_b08 = (code *)0x124cd0;
    test_bson_validate_bool_cold_7();
LAB_00124cd0:
    pcStack_b08 = (code *)0x124cd5;
    test_bson_validate_bool_cold_8();
LAB_00124cd5:
    pcStack_b08 = (code *)0x124cda;
    test_bson_validate_bool_cold_12();
LAB_00124cda:
    pcStack_b08 = (code *)0x124cdf;
    test_bson_validate_bool_cold_10();
LAB_00124cdf:
    pcStack_b08 = (code *)0x124ce4;
    test_bson_validate_bool_cold_11();
  }
  else {
    pcStack_b08 = (code *)0x124bcf;
    cVar1 = bson_validate(auStack_a00,0,&lStack_a98);
    if (cVar1 == '\0') goto LAB_00124cb2;
    pcStack_b08 = (code *)0x124bec;
    cVar1 = bson_iter_init(auStack_a80,auStack_a00);
    if (cVar1 == '\0') goto LAB_00124cb7;
    pcStack_b08 = (code *)0x124c01;
    cVar1 = bson_iter_next(auStack_a80);
    if (cVar1 == '\0') goto LAB_00124cbc;
    pcStack_b08 = (code *)0x124c16;
    iVar2 = bson_iter_type(auStack_a80);
    if (iVar2 != 8) goto LAB_00124cc1;
    pcStack_b08 = (code *)0x124c2c;
    cVar1 = bson_iter_bool(auStack_a80);
    if (cVar1 == '\0') goto LAB_00124cc6;
    if (cStack_a89 != '\x01') goto LAB_00124ccb;
    _uStack_a90 = CONCAT17(0xff,uStack_a90);
    pcStack_b08 = (code *)0x124c5a;
    cVar1 = bson_init_static(auStack_a00,&stack0xfffffffffffff570,9);
    if (cVar1 == '\0') goto LAB_00124cd0;
    pcStack_b08 = (code *)0x124c72;
    cVar1 = bson_validate(auStack_a00,0,&lStack_a98);
    if (cVar1 != '\0') goto LAB_00124cd5;
    if (lStack_a98 == 7) {
      pcStack_b08 = (code *)0x124c93;
      cVar1 = bson_iter_init(auStack_a80,auStack_a00);
      if (cVar1 == '\0') goto LAB_00124cda;
      pcStack_b08 = (code *)0x124ca4;
      cVar1 = bson_iter_next(auStack_a80);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124cdf;
    }
  }
  pcStack_b08 = test_bson_validate_dbpointer;
  test_bson_validate_bool_cold_9();
  uStack_d10 = 0xe072;
  uStack_d0e = 0x614171c4e917c9;
  uStack_d20 = 0x1a;
  uStack_d1c = 0x200610c;
  uStack_d18 = 0;
  uStack_d16 = 0x6200;
  uStack_d14 = 0xfce15600;
  lStack_d40 = 0;
  puStack_b10 = auStack_800;
  pcStack_b08 = (code *)apcStack_888;
  cVar1 = bson_init_static(auStack_c80,&uStack_d20,0x1a);
  if (cVar1 == '\0') {
    test_bson_validate_dbpointer_cold_1();
LAB_00124e6a:
    test_bson_validate_dbpointer_cold_2();
LAB_00124e6f:
    test_bson_validate_dbpointer_cold_3();
LAB_00124e74:
    test_bson_validate_dbpointer_cold_4();
LAB_00124e79:
    test_bson_validate_dbpointer_cold_5();
LAB_00124e7e:
    test_bson_validate_dbpointer_cold_8();
LAB_00124e83:
    test_bson_validate_dbpointer_cold_9();
LAB_00124e88:
    test_bson_validate_dbpointer_cold_13();
LAB_00124e8d:
    test_bson_validate_dbpointer_cold_11();
LAB_00124e92:
    test_bson_validate_dbpointer_cold_12();
LAB_00124e97:
    test_bson_validate_dbpointer_cold_7();
  }
  else {
    cVar1 = bson_validate(auStack_c80,0,&lStack_d40);
    if (cVar1 == '\0') goto LAB_00124e6a;
    cVar1 = bson_iter_init(auStack_d00,auStack_c80);
    if (cVar1 == '\0') goto LAB_00124e6f;
    cVar1 = bson_iter_next(auStack_d00);
    if (cVar1 == '\0') goto LAB_00124e74;
    iVar2 = bson_iter_type(auStack_d00);
    if (iVar2 != 0xc) goto LAB_00124e79;
    bson_iter_dbpointer(auStack_d00,&iStack_d34,&pcStack_d28,auStack_d30);
    if (pcStack_d28 != "b") {
      iVar2 = strcmp(pcStack_d28,"b");
      if (iVar2 != 0) goto LAB_00124ea1;
    }
    if (iStack_d34 != 1) goto LAB_00124e97;
    if ((char)uStack_d14 != '\0') goto LAB_00124e7e;
    uStack_d14 = CONCAT31(uStack_d14._1_3_,0xff);
    cVar1 = bson_init_static(auStack_c80,&uStack_d20,0x1a);
    if (cVar1 == '\0') goto LAB_00124e83;
    cVar1 = bson_validate(auStack_c80,0,&lStack_d40);
    if (cVar1 != '\0') goto LAB_00124e88;
    if (lStack_d40 == 0xc) {
      cVar1 = bson_iter_init(auStack_d00,auStack_c80);
      if (cVar1 == '\0') goto LAB_00124e8d;
      cVar1 = bson_iter_next(auStack_d00);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124e92;
    }
  }
  test_bson_validate_dbpointer_cold_10();
LAB_00124ea1:
  test_bson_validate_dbpointer_cold_6();
  iVar2 = 1000000;
  do {
    uVar7 = bson_new();
    bson_destroy(uVar7);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static void
test_bson_append_maxkey (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   BSON_ASSERT (bson_append_maxkey (b, "maxkey", -1));
   b2 = get_bson ("test37.bson");
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}